

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O0

vector<CTxMemPool::delta_info,_std::allocator<CTxMemPool::delta_info>_> * __thiscall
CTxMemPool::GetPrioritisedTransactions(CTxMemPool *this)

{
  long lVar1;
  bool bVar2;
  iterator this_00;
  char *pszName;
  long in_RSI;
  vector<CTxMemPool::delta_info,_std::allocator<CTxMemPool::delta_info>_> *in_RDI;
  long in_FS_OFFSET;
  bool in_mempool;
  type *delta;
  type *txid;
  map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_> *__range1
  ;
  vector<CTxMemPool::delta_info,_std::allocator<CTxMemPool::delta_info>_> *result;
  iterator iter;
  const_iterator __end1;
  const_iterator __begin1;
  optional<long> modified_fee;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock14;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
  *in_stack_fffffffffffffec0;
  CTxMemPoolEntry *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  undefined8 in_stack_fffffffffffffed8;
  AnnotatedMixin<std::recursive_mutex> *mutexIn;
  char *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pszName = (char *)(in_RSI + 0x58);
  mutexIn = (AnnotatedMixin<std::recursive_mutex> *)0x1116202;
  this_01 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txmempool.cpp";
  AssertLockNotHeldInline
            ((char *)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
             in_stack_fffffffffffffebc,(RecursiveMutex *)0x768681);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)this_01,mutexIn,pszName,
             (char *)in_RDI,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffed8 >> 0x18,0));
  std::vector<CTxMemPool::delta_info,_std::allocator<CTxMemPool::delta_info>_>::vector
            ((vector<CTxMemPool::delta_info,_std::allocator<CTxMemPool::delta_info>_> *)
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  std::map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>::
  size((map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_> *)
       CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  std::vector<CTxMemPool::delta_info,_std::allocator<CTxMemPool::delta_info>_>::reserve
            ((vector<CTxMemPool::delta_info,_std::allocator<CTxMemPool::delta_info>_> *)this_01,
             (size_type)mutexIn);
  std::map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>::
  begin((map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_> *)
        in_stack_fffffffffffffec0);
  std::map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>::end
            ((map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
              *)in_stack_fffffffffffffec0);
  while (bVar2 = std::operator==((_Self *)in_stack_fffffffffffffec8,
                                 (_Self *)in_stack_fffffffffffffec0), ((bVar2 ^ 0xffU) & 1) != 0) {
    std::_Rb_tree_const_iterator<std::pair<const_uint256,_long>_>::operator*
              ((_Rb_tree_const_iterator<std::pair<const_uint256,_long>_> *)
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    std::get<0ul,uint256_const,long>
              ((pair<const_uint256,_long> *)
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    std::get<1ul,uint256_const,long>
              ((pair<const_uint256,_long> *)
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    this_00 = boost::multi_index::detail::
              hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
              ::find<uint256>(in_stack_fffffffffffffec0,
                              (uint256 *)
                              CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    boost::multi_index::detail::
    hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
    ::end((hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
           *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    bVar2 = boost::operators_impl::operator!=
                      ((hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
                        *)in_stack_fffffffffffffec8,
                       (hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
                        *)in_stack_fffffffffffffec0);
    in_stack_fffffffffffffed7 = bVar2;
    std::optional<long>::optional
              ((optional<long> *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    if (bVar2) {
      in_stack_fffffffffffffec8 =
           boost::operators_impl::
           dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
           ::operator->((dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
                         *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      in_stack_fffffffffffffec0 =
           (hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
            *)CTxMemPoolEntry::GetModifiedFee
                        ((CTxMemPoolEntry *)
                         CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      std::optional<long>::optional<long,_true>
                ((optional<long> *)in_stack_fffffffffffffec8,(long *)in_stack_fffffffffffffec0);
    }
    std::vector<CTxMemPool::delta_info,_std::allocator<CTxMemPool::delta_info>_>::
    emplace_back<CTxMemPool::delta_info>
              ((vector<CTxMemPool::delta_info,_std::allocator<CTxMemPool::delta_info>_> *)
               this_00.node,
               (delta_info *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    std::_Rb_tree_const_iterator<std::pair<const_uint256,_long>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_uint256,_long>_> *)
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::vector<CTxMemPool::delta_info> CTxMemPool::GetPrioritisedTransactions() const
{
    AssertLockNotHeld(cs);
    LOCK(cs);
    std::vector<delta_info> result;
    result.reserve(mapDeltas.size());
    for (const auto& [txid, delta] : mapDeltas) {
        const auto iter{mapTx.find(txid)};
        const bool in_mempool{iter != mapTx.end()};
        std::optional<CAmount> modified_fee;
        if (in_mempool) modified_fee = iter->GetModifiedFee();
        result.emplace_back(delta_info{in_mempool, delta, modified_fee, txid});
    }
    return result;
}